

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

int scroll_height_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Object local_20;
  
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_20,0x67);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)self,0x65);
  iVar2 = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::~Am_Object(&local_20);
  return (iVar1 - iVar2) + -10;
}

Assistant:

Am_Define_Formula(int, scroll_height) {
  return (int)self.Get_Owner().Get(Am_HEIGHT) - 10 - (int)self.Get(Am_TOP);
}